

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferVAOInputAttacher::drawContainer
          (BufferVAOInputAttacher *this,GLuint vao,Surface *dst)

{
  ostringstream *this_00;
  undefined1 local_198 [384];
  
  ScaleProgram::draw(this->m_program,vao,1.0,false,dst);
  local_198._0_8_ = ((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"// Drew an output image with VAO ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  return;
}

Assistant:

void BufferVAOInputAttacher::drawContainer (GLuint vao, Surface& dst)
{
	m_program.draw(vao, 1.0, false, &dst);
	log() << TestLog::Message << "// Drew an output image with VAO " << vao
		  << TestLog::EndMessage;
}